

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceEngine.cpp
# Opt level: O2

void __thiscall Inferences::CompositeGIE::detach(CompositeGIE *this)

{
  GIList *pGVar1;
  GIList **ppGVar2;
  
  ppGVar2 = &this->_inners;
  while (pGVar1 = *ppGVar2, pGVar1 != (GIList *)0x0) {
    (*(pGVar1->_head->super_SimplifyingGeneratingInference).super_InferenceEngine.
      _vptr_InferenceEngine[3])();
    ppGVar2 = &pGVar1->_tail;
  }
  (this->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.super_InferenceEngine
  ._salg = (SaturationAlgorithm *)0x0;
  return;
}

Assistant:

void CompositeGIE::detach()
{
  GIList* eit=_inners;
  while(eit) {
    eit->head()->detach();
    eit=eit->tail();
  }
  GeneratingInferenceEngine::detach();
}